

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O2

void stressing_single_thread(void)

{
  ostream *poVar1;
  int v;
  Logger local_1000;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"----------stressing test single thread-----------"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  for (v = 0; v != 100000; v = v + 1) {
    tt::Logger::Logger(&local_1000,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/base/tests/LoggingTest.cpp"
                       ,0x30);
    tt::LogStream::operator<<((LogStream *)&local_1000,v);
    tt::Logger::~Logger(&local_1000);
  }
  return;
}

Assistant:

void stressing_single_thread()
{
    // 100000 lines
    cout << "----------stressing test single thread-----------" << endl;
    for (int i = 0; i < 100000; ++i)
    {
        LOG << i;
    }
}